

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<(anonymous_namespace)::Constructable_const*,(anonymous_namespace)::Constructable_const*>
          (string *__return_storage_ptr__,Detail *this,Constructable *first,Constructable *last)

{
  Constructable *pCVar1;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  string local_50;
  
  ReusableStringStream::ReusableStringStream(&local_60);
  std::operator<<(local_60.m_oss,"{ ");
  if ((Constructable *)this != first) {
    StringRef::operator_cast_to_string(&local_50,(StringRef *)unprintableString);
    std::operator<<(local_60.m_oss,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    for (pCVar1 = (Constructable *)(this + 8); pCVar1 != first; pCVar1 = pCVar1 + 1) {
      std::operator<<(local_60.m_oss,", ");
      StringRef::operator_cast_to_string(&local_50,(StringRef *)unprintableString);
      std::operator<<(local_60.m_oss,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::operator<<(local_60.m_oss," }");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,&local_60);
  ReusableStringStream::~ReusableStringStream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }